

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback(CodedInputStream *this,uint32 *value)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint64 result;
  uint32 local_10 [2];
  
  pbVar3 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar3 < 10) && ((pbVar1 <= pbVar3 || ((char)pbVar1[-1] < '\0')))) {
    bVar2 = ReadVarint64Fallback(this,(uint64 *)local_10);
    if (bVar2) {
      *value = local_10[0];
    }
  }
  else {
    uVar4 = *pbVar3 & 0x7f;
    if ((char)*pbVar3 < '\0') {
      uVar4 = uVar4 | (pbVar3[1] & 0x7f) << 7;
      if ((char)pbVar3[1] < '\0') {
        uVar4 = uVar4 | (pbVar3[2] & 0x7f) << 0xe;
        if ((char)pbVar3[2] < '\0') {
          uVar4 = uVar4 | (pbVar3[3] & 0x7f) << 0x15;
          if ((char)pbVar3[3] < '\0') {
            uVar4 = uVar4 | (uint)pbVar3[4] << 0x1c;
            if ((char)pbVar3[4] < '\0') {
              pbVar3 = pbVar3 + 6;
              iVar5 = 5;
              while ((char)pbVar3[-1] < '\0') {
                pbVar3 = pbVar3 + 1;
                iVar5 = iVar5 + -1;
                if (iVar5 == 0) {
                  return false;
                }
              }
            }
            else {
              pbVar3 = pbVar3 + 5;
            }
          }
          else {
            pbVar3 = pbVar3 + 4;
          }
        }
        else {
          pbVar3 = pbVar3 + 3;
        }
      }
      else {
        pbVar3 = pbVar3 + 2;
      }
    }
    else {
      pbVar3 = pbVar3 + 1;
    }
    *value = uVar4;
    this->buffer_ = pbVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CodedInputStream::ReadVarint32Fallback(uint32* value) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  If the varint ends at exactly the end of the buffer,
      // we can detect that and still use the fast path.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    const uint8* end = ReadVarint32FromArray(buffer_, value);
    if (end == NULL) return false;
    buffer_ = end;
    return true;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarint32Slow(value);
  }
}